

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O3

void __thiscall
vkb::detail::GenericFeatureChain::add<VkPhysicalDeviceVulkan13Features>
          (GenericFeatureChain *this,VkPhysicalDeviceVulkan13Features *features)

{
  pointer *ppGVar1;
  iterator __position;
  undefined4 uVar2;
  long lVar3;
  GenericFeaturesPNextNode *pGVar4;
  GenericFeaturesPNextNode *pGVar5;
  byte bVar6;
  GenericFeaturesPNextNode local_430;
  
  bVar6 = 0;
  pGVar4 = (this->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->nodes).
       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar4 != __position._M_current) {
    do {
      if (features->sType == pGVar4->sType) {
        memset(local_430.fields + 0x10,0,0x3c0);
        pGVar5 = &local_430;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          uVar2 = *(undefined4 *)&features->field_0x4;
          pGVar5->sType = features->sType;
          *(undefined4 *)&pGVar5->field_0x4 = uVar2;
          features = (VkPhysicalDeviceVulkan13Features *)((long)features + (ulong)bVar6 * -0x10 + 8)
          ;
          pGVar5 = (GenericFeaturesPNextNode *)((long)pGVar5 + (ulong)bVar6 * -0x10 + 8);
        }
        GenericFeaturesPNextNode::combine(pGVar4,&local_430);
        return;
      }
      pGVar4 = pGVar4 + 1;
    } while (pGVar4 != __position._M_current);
  }
  memset(local_430.fields + 0x10,0,0x3c0);
  pGVar4 = &local_430;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar2 = *(undefined4 *)&features->field_0x4;
    pGVar4->sType = features->sType;
    *(undefined4 *)&pGVar4->field_0x4 = uVar2;
    features = (VkPhysicalDeviceVulkan13Features *)((long)features + (ulong)bVar6 * -0x10 + 8);
    pGVar4 = (GenericFeaturesPNextNode *)((long)pGVar4 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  if (__position._M_current ==
      (this->nodes).
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::_M_realloc_insert<vkb::detail::GenericFeaturesPNextNode>(&this->nodes,__position,&local_430);
  }
  else {
    memcpy(__position._M_current,&local_430,0x410);
    ppGVar1 = &(this->nodes).
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }